

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O2

void __thiscall tcu::ThreadUtil::Operation::execute(Operation *this,Thread *thread)

{
  pointer pSVar1;
  Result RVar2;
  bool bVar3;
  long lVar4;
  int depNdx;
  long lVar5;
  SharedPtr<tcu::ThreadUtil::Event> local_48;
  
  bVar3 = true;
  lVar4 = 0;
  lVar5 = 0;
  while( true ) {
    pSVar1 = (this->m_deps).
             super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->m_deps).
                            super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) >> 4) <=
        lVar5) break;
    RVar2 = Event::waitReady(*(Event **)((long)&pSVar1->m_ptr + lVar4));
    bVar3 = (bool)(bVar3 & RVar2 == RESULT_OK);
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0x10;
  }
  if (bVar3) {
    (*this->_vptr_Operation[2])(this,thread);
    RVar2 = RESULT_OK;
  }
  else {
    RVar2 = RESULT_FAILED;
  }
  Event::setResult((this->m_event).m_ptr,RVar2);
  std::
  vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
  ::clear(&this->m_deps);
  local_48.m_ptr = (Event *)0x0;
  local_48.m_state = (SharedPtrStateBase *)0x0;
  de::SharedPtr<tcu::ThreadUtil::Event>::operator=(&this->m_event,&local_48);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr(&local_48);
  return;
}

Assistant:

void Operation::execute (Thread& thread)
{
	bool success = true;

	// Wait for dependencies and check that they succeeded
	for (int depNdx = 0; depNdx < (int)m_deps.size(); depNdx++)
	{
		if (m_deps[depNdx]->waitReady() != Event::RESULT_OK)
			success = false;
	}

	// Try execute operation
	if (success)
	{
		try
		{
			exec(thread);
		}
		catch (...)
		{
			// Got exception event failed
			m_event->setResult(Event::RESULT_FAILED);
			throw;
		}

		m_event->setResult(Event::RESULT_OK);
	}
	else
		// Some dependencies failed
		m_event->setResult(Event::RESULT_FAILED);

	// Release resources
	m_deps.clear();
	m_event = SharedPtr<Event>();
}